

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O3

exr_result_t
internal_coding_update_channel_info
          (exr_coding_channel_info_t *channels,int16_t num_chans,exr_chunk_info_t *cinfo,
          exr_const_context_t ctxt,exr_const_priv_part_t part)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  exr_attr_chlist_t *peVar6;
  exr_attr_chlist_entry_t *peVar7;
  uint uVar8;
  int iVar9;
  exr_result_t eVar10;
  int iVar11;
  uint uVar12;
  undefined6 in_register_00000032;
  uint16_t *puVar13;
  uint uVar14;
  long lVar15;
  
  peVar6 = (part->channels->field_6).chlist;
  uVar1 = peVar6->num_channels;
  if (uVar1 == (uint)CONCAT62(in_register_00000032,num_chans)) {
    if (0 < (int)uVar1) {
      peVar7 = peVar6->entries;
      iVar2 = cinfo->start_y;
      uVar3 = cinfo->height;
      uVar12 = (iVar2 + uVar3) - 1;
      uVar8 = 1 - (iVar2 + uVar3);
      if (0 < (int)(iVar2 + uVar3)) {
        uVar8 = uVar12;
      }
      iVar4 = cinfo->width;
      puVar13 = &channels->data_type;
      lVar15 = 0;
      do {
        ((exr_coding_channel_info_t *)(puVar13 + -0xd))->channel_name =
             *(char **)(peVar7->reserved + lVar15 + -0xd);
        uVar5 = *(uint *)(peVar7->reserved + lVar15 + 7);
        uVar14 = uVar3;
        if (1 < (int)uVar5) {
          iVar11 = iVar2 % (int)uVar5;
          if (uVar3 == 1) {
            uVar14 = (uint)(iVar11 == 0);
          }
          else {
            iVar9 = uVar5 - iVar11;
            if (iVar11 == 0) {
              iVar9 = 0;
            }
            uVar14 = 0;
            iVar11 = uVar12 - uVar8 % uVar5;
            if (iVar9 + iVar2 <= iVar11) {
              uVar14 = (iVar11 - (iVar9 + iVar2)) / (int)uVar5 + 1;
            }
          }
        }
        *(uint *)(puVar13 + -9) = uVar14;
        iVar11 = *(int *)(peVar7->reserved + lVar15 + 3);
        iVar9 = 1;
        if (iVar11 < 2) {
          iVar9 = iVar4;
        }
        if (1 < iVar11 && iVar4 != 1) {
          iVar9 = iVar4 / iVar11;
        }
        *(int *)(puVar13 + -7) = iVar9;
        *(int *)(puVar13 + -5) = iVar11;
        *(uint *)(puVar13 + -3) = uVar5;
        *(uint8_t *)(puVar13 + -1) = peVar7->reserved[lVar15 + -1];
        iVar11 = *(int *)(peVar7->reserved + lVar15 + -5);
        *(char *)((long)puVar13 + -1) = (iVar11 != 1) * '\x02' + '\x02';
        *puVar13 = (uint16_t)iVar11;
        puVar13 = puVar13 + 0x18;
        lVar15 = lVar15 + 0x20;
      } while ((ulong)uVar1 << 5 != lVar15);
    }
    return 0;
  }
  eVar10 = (*ctxt->print_error)
                     (ctxt,3,"Mismatch in channel counts: stored %d, incoming %d",
                      CONCAT62(in_register_00000032,num_chans) & 0xffffffff,(ulong)uVar1,
                      ctxt->print_error);
  return eVar10;
}

Assistant:

exr_result_t
internal_coding_update_channel_info (
    exr_coding_channel_info_t* channels,
    int16_t                    num_chans,
    const exr_chunk_info_t*    cinfo,
    exr_const_context_t        ctxt,
    exr_const_priv_part_t      part)
{
    int                chans;
    exr_attr_chlist_t* chanlist;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;

    if (num_chans != chans)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Mismatch in channel counts: stored %d, incoming %d",
            num_chans,
            chans);

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     ccic = (channels + c);

        ccic->channel_name = curc->name.str;

        ccic->height = compute_sampled_height (
            cinfo->height, curc->y_sampling, cinfo->start_y);
        ccic->width = compute_sampled_width (
            cinfo->width, curc->x_sampling, cinfo->start_x);

        ccic->x_samples = curc->x_sampling;
        ccic->y_samples = curc->y_sampling;

        ccic->p_linear          = curc->p_linear;
        ccic->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        ccic->data_type         = (uint16_t) (curc->pixel_type);
    }

    return EXR_ERR_SUCCESS;
}